

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

int event_add_nolock_(event *ev,timeval *tv,int tv_is_absolute)

{
  timeval *tv_00;
  event_base *base;
  unsigned_long uVar1;
  short *psVar2;
  __suseconds_t _Var3;
  event_callback *peVar4;
  ulong uVar5;
  void *pvVar6;
  void *pvVar7;
  event *peVar8;
  common_timeout_list *ctl;
  long lVar9;
  byte bVar10;
  event **ppeVar11;
  ushort uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  unsigned_long uVar17;
  ulong uVar18;
  event_callback *peVar19;
  event_debug_entry *peVar20;
  uint uVar21;
  char *pcVar22;
  long lVar23;
  long lVar24;
  undefined8 uVar25;
  event *extraout_RDX;
  event *extraout_RDX_00;
  event *peVar26;
  event_callback ***pppeVar27;
  event ***pppeVar28;
  char *pcVar29;
  char *pcVar30;
  char *pcVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  timeval now;
  
  base = ev->ev_base;
  if (((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
     (iVar13 = evthread_is_debug_lock_held_(base->th_base_lock), iVar13 == 0)) {
    pcVar22 = "evthread_is_debug_lock_held_((base)->th_base_lock)";
    pcVar29 = "event_add_nolock_";
    uVar25 = 0xa2f;
    goto LAB_001c3fc4;
  }
  event_debug_assert_is_setup_(ev);
  if (event_debug_logging_mask_ != 0) {
    uVar12 = ev->ev_events;
    pcVar22 = "EV_READ ";
    if ((uVar12 & 2) == 0) {
      pcVar22 = " ";
    }
    pcVar29 = "EV_WRITE ";
    if ((uVar12 & 4) == 0) {
      pcVar29 = " ";
    }
    pcVar30 = "EV_CLOSED ";
    if (-1 < (char)uVar12) {
      pcVar30 = " ";
    }
    pcVar31 = "EV_TIMEOUT ";
    if (tv == (timeval *)0x0) {
      pcVar31 = " ";
    }
    event_debugx_("event_add: event: %p (fd %d), %s%s%s%scall %p",ev,(ulong)(uint)ev->ev_fd,pcVar22,
                  pcVar29,pcVar30,pcVar31,(ev->ev_evcallback).evcb_cb_union.evcb_callback);
  }
  uVar12 = (ev->ev_evcallback).evcb_flags;
  if (0xff < uVar12) {
    pcVar22 = "!(ev->ev_flags & ~EVLIST_ALL)";
    pcVar29 = "event_add_nolock_";
    uVar25 = 0xa3c;
    goto LAB_001c3fc4;
  }
  if ((uVar12 & 0x40) != 0) {
    return -1;
  }
  if (((uVar12 & 1) == 0 && tv != (timeval *)0x0) &&
     (iVar13 = min_heap_reserve_(&base->timeheap,(base->timeheap).n + 1), iVar13 == -1)) {
    return -1;
  }
  if ((((event *)base->current_event == ev) &&
      (evthread_id_fn_ != (_func_unsigned_long *)0x0 && (ev->ev_events & 8) != 0)) &&
     (uVar1 = base->th_owner_id, uVar17 = (*evthread_id_fn_)(), uVar1 != uVar17)) {
    base->current_event_waiters = base->current_event_waiters + 1;
    if (base->current_event_cond != (void *)0x0) {
      (*evthread_cond_fns_.wait_condition)
                (base->current_event_cond,base->th_base_lock,(timeval *)0x0);
    }
  }
  uVar12 = ev->ev_events;
  bVar32 = false;
  if ((uVar12 & 0x8e) == 0) {
    iVar13 = 0;
  }
  else {
    iVar13 = 0;
    if (((ev->ev_evcallback).evcb_flags & 0x2a) == 0) {
      if ((uVar12 & 0x86) == 0) {
        iVar14 = 0;
        if ((uVar12 & 8) != 0) {
          iVar14 = evmap_signal_add_(base,ev->ev_fd,ev);
          goto LAB_001c3b04;
        }
      }
      else {
        iVar14 = evmap_io_add_(base,ev->ev_fd,ev);
LAB_001c3b04:
        if (iVar14 == -1) {
          bVar10 = 0;
          iVar13 = -1;
          bVar32 = false;
          goto LAB_001c3e8d;
        }
      }
      if (((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
         (iVar13 = evthread_is_debug_lock_held_(base->th_base_lock), iVar13 == 0)) {
        pcVar22 = "evthread_is_debug_lock_held_((base)->th_base_lock)";
        pcVar29 = "event_queue_insert_inserted";
        uVar25 = 0xd26;
        goto LAB_001c3fc4;
      }
      uVar12 = (ev->ev_evcallback).evcb_flags;
      if ((uVar12 & 2) != 0) {
        uVar16 = ev->ev_fd;
        pcVar29 = "%s: %p(fd %d) already inserted";
        pcVar22 = "event_queue_insert_inserted";
        goto LAB_001c4019;
      }
      iVar13 = base->event_count + (uint)((uVar12 & 0x10) == 0);
      base->event_count = iVar13;
      if (iVar13 < base->event_count_max) {
        iVar13 = base->event_count_max;
      }
      base->event_count_max = iVar13;
      psVar2 = &(ev->ev_evcallback).evcb_flags;
      *(byte *)psVar2 = (byte)*psVar2 | 2;
      bVar32 = iVar14 == 1;
      iVar13 = 0;
      if (!bVar32) {
        iVar13 = iVar14;
      }
    }
  }
  bVar10 = 1;
  if (tv == (timeval *)0x0) goto LAB_001c3e8d;
  if ((tv_is_absolute == 0) && ((ev->ev_evcallback).evcb_closure == '\x02')) {
    _Var3 = tv->tv_usec;
    (ev->ev_).ev_io.ev_timeout.tv_sec = tv->tv_sec;
    (ev->ev_).ev_io.ev_timeout.tv_usec = _Var3;
  }
  uVar12 = (ev->ev_evcallback).evcb_flags;
  if ((uVar12 & 1) != 0) {
    event_queue_remove_timeout(base,ev);
    uVar12 = (ev->ev_evcallback).evcb_flags;
  }
  if (((uVar12 & 8) != 0) && ((ev->ev_res & 1) != 0)) {
    if (((ev->ev_events & 8) != 0) &&
       (((ev->ev_).ev_signal.ev_ncalls != 0 &&
        (psVar2 = (ev->ev_).ev_signal.ev_pncalls, psVar2 != (short *)0x0)))) {
      *psVar2 = 0;
    }
    event_queue_remove_active(base,&ev->ev_evcallback);
  }
  gettime(base,&now);
  iVar14 = is_common_timeout(tv,base);
  if (tv_is_absolute == 0) {
    if (iVar14 == 0) {
      lVar23 = tv->tv_sec + now.tv_sec;
      (ev->ev_timeout).tv_sec = lVar23;
      lVar24 = tv->tv_usec + now.tv_usec;
      (ev->ev_timeout).tv_usec = lVar24;
      if (lVar24 < 1000000) goto LAB_001c3c89;
      (ev->ev_timeout).tv_sec = lVar23 + 1;
      uVar18 = lVar24 - 1000000;
    }
    else {
      _Var3 = tv->tv_usec;
      lVar23 = now.tv_sec + tv->tv_sec;
      (ev->ev_timeout).tv_sec = lVar23;
      uVar18 = (ulong)((uint)_Var3 & 0xfffff) + now.tv_usec;
      (ev->ev_timeout).tv_usec = uVar18;
      if (999999 < (long)uVar18) {
        (ev->ev_timeout).tv_sec = lVar23 + 1;
        uVar18 = uVar18 - 1000000;
        (ev->ev_timeout).tv_usec = uVar18;
      }
      uVar18 = tv->tv_usec & 0xfffffffffff00000U | uVar18;
    }
    (ev->ev_timeout).tv_usec = uVar18;
  }
  else {
    _Var3 = tv->tv_usec;
    (ev->ev_timeout).tv_sec = tv->tv_sec;
    (ev->ev_timeout).tv_usec = _Var3;
  }
LAB_001c3c89:
  if (event_debug_logging_mask_ != 0) {
    event_debugx_("event_add: event %p, timeout in %d seconds %d useconds, call %p",ev,
                  (ulong)(uint)tv->tv_sec,(ulong)(uint)tv->tv_usec,
                  (ev->ev_evcallback).evcb_cb_union.evcb_callback);
  }
  if (((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
     (iVar15 = evthread_is_debug_lock_held_(base->th_base_lock), iVar15 == 0)) {
    pcVar22 = "evthread_is_debug_lock_held_((base)->th_base_lock)";
    pcVar29 = "event_queue_insert_timeout";
    uVar25 = 0xd5c;
LAB_001c3fc4:
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,uVar25,pcVar22,pcVar29);
  }
  uVar12 = (ev->ev_evcallback).evcb_flags;
  if ((uVar12 & 1) != 0) {
    uVar16 = ev->ev_fd;
    pcVar29 = "%s: %p(fd %d) already on timeout";
    pcVar22 = "event_queue_insert_timeout";
LAB_001c4019:
    event_errx(1,pcVar29,pcVar22,ev,(ulong)uVar16);
  }
  iVar15 = base->event_count + (uint)((uVar12 & 0x10) == 0);
  base->event_count = iVar15;
  if (iVar15 < base->event_count_max) {
    iVar15 = base->event_count_max;
  }
  base->event_count_max = iVar15;
  psVar2 = &(ev->ev_evcallback).evcb_flags;
  *(byte *)psVar2 = (byte)*psVar2 | 1;
  tv_00 = &ev->ev_timeout;
  iVar15 = is_common_timeout(tv_00,base);
  if (iVar15 == 0) {
    uVar16 = (base->timeheap).n;
    peVar26 = extraout_RDX;
    if (uVar16 != 0xffffffff) {
      iVar15 = min_heap_reserve_(&base->timeheap,uVar16 + 1);
      peVar26 = extraout_RDX_00;
      if (iVar15 == 0) {
        uVar16 = (base->timeheap).n;
        (base->timeheap).n = uVar16 + 1;
        while( true ) {
          peVar26 = (event *)(base->timeheap).p;
          if (uVar16 == 0) break;
          uVar21 = uVar16 - 1 >> 1;
          peVar8 = (event *)(&(peVar26->ev_evcallback).evcb_active_next.tqe_next)[uVar21];
          lVar23 = tv_00->tv_sec;
          lVar24 = (peVar8->ev_timeout).tv_sec;
          bVar34 = SBORROW8(lVar24,lVar23);
          lVar9 = lVar24 - lVar23;
          bVar33 = lVar24 == lVar23;
          if (bVar33) {
            lVar23 = (peVar8->ev_timeout).tv_usec;
            lVar24 = (ev->ev_timeout).tv_usec;
            bVar34 = SBORROW8(lVar23,lVar24);
            lVar9 = lVar23 - lVar24;
            bVar33 = lVar23 == lVar24;
          }
          if (bVar33 || bVar34 != lVar9 < 0) break;
          (&(peVar26->ev_evcallback).evcb_active_next.tqe_next)[uVar16] = (event_callback *)peVar8;
          (peVar8->ev_timeout_pos).min_heap_idx = uVar16;
          uVar16 = uVar21;
        }
        (&(peVar26->ev_evcallback).evcb_active_next.tqe_next)[uVar16] = &ev->ev_evcallback;
        (ev->ev_timeout_pos).min_heap_idx = uVar16;
      }
    }
  }
  else {
    uVar18 = (ev->ev_timeout).tv_usec;
    peVar19 = *(event_callback **)
               ((long)base->common_timeout_queues + (ulong)((uint)(uVar18 >> 0x11) & 0x7f8));
    ppeVar11 = (event **)((long)peVar19 + 8);
    pppeVar27 = (event_callback ***)ppeVar11;
    while (peVar4 = *(((event *)*pppeVar27)->ev_evcallback).evcb_active_next.tqe_prev,
          peVar4 != (event_callback *)0x0) {
      uVar5 = *(ulong *)&peVar4[3].evcb_active_next;
      if (0xfffff < (uVar5 ^ uVar18)) {
        pcVar22 = "is_same_common_timeout(&e->ev_timeout, &ev->ev_timeout)";
        pcVar29 = "insert_common_timeout_inorder";
        uVar25 = 0xd18;
        goto LAB_001c3fc4;
      }
      pvVar6 = peVar4[2].evcb_arg;
      pvVar7 = (void *)tv_00->tv_sec;
      bVar33 = SBORROW8((long)pvVar7,(long)pvVar6);
      lVar23 = (long)pvVar7 - (long)pvVar6;
      if (pvVar7 == pvVar6) {
        bVar33 = SBORROW8(uVar18,uVar5);
        lVar23 = uVar18 - uVar5;
      }
      if (bVar33 == lVar23 < 0) {
        peVar19 = peVar4 + 1;
        break;
      }
      pppeVar27 = &peVar4[1].evcb_active_next.tqe_prev;
    }
    peVar26 = *(event **)&peVar19->evcb_active_next;
    pppeVar28 = &(peVar26->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev;
    if (peVar26 == (event *)0x0) {
      pppeVar28 = (event ***)ppeVar11;
    }
    (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_next = peVar26;
    *pppeVar28 = (event **)&ev->ev_timeout_pos;
    *(event **)&peVar19->evcb_active_next = ev;
    (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev = (event **)peVar19;
  }
  if (iVar14 == 0) {
    if ((ev->ev_timeout_pos).min_heap_idx != 0) {
      bVar10 = 1;
      if (((base->timeheap).n != 0) && (peVar26 = *(base->timeheap).p, peVar26 != (event *)0x0)) {
        lVar23 = (peVar26->ev_timeout).tv_sec;
        bVar33 = SBORROW8(lVar23,now.tv_sec);
        lVar24 = lVar23 - now.tv_sec;
        if (lVar23 == now.tv_sec) {
          lVar24 = (peVar26->ev_timeout).tv_usec;
          bVar33 = SBORROW8(lVar24,now.tv_usec);
          lVar24 = lVar24 - now.tv_usec;
        }
        if (bVar33 != lVar24 < 0) {
          bVar32 = true;
        }
      }
      goto LAB_001c3e8d;
    }
    bVar32 = true;
  }
  else {
    ctl = *(common_timeout_list **)
           ((long)base->common_timeout_queues +
           (ulong)((uint)(ev->ev_timeout).tv_usec >> 0x11 & 0x7f8));
    if ((ctl->events).tqh_first == ev) {
      common_timeout_schedule(ctl,(timeval *)ev,peVar26);
    }
  }
  bVar10 = 1;
LAB_001c3e8d:
  if ((((bool)(evthread_id_fn_ != (_func_unsigned_long *)0x0 & bVar32 & bVar10)) &&
      (base->running_loop != 0)) &&
     (uVar1 = base->th_owner_id, uVar17 = (*evthread_id_fn_)(), uVar1 != uVar17)) {
    evthread_notify_base(base);
  }
  if (event_debug_mode_on_ != 0) {
    peVar20 = (event_debug_entry *)event_debug_map_lock_;
    now.tv_usec = (__suseconds_t)ev;
    if (event_debug_map_lock_ != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,event_debug_map_lock_);
    }
    peVar20 = event_debug_map_HT_FIND((event_debug_map *)&now,peVar20);
    if (peVar20 == (event_debug_entry *)0x0) {
      event_errx(-0x21522153,
                 "%s: noting an add on a non-setup event %p (events: 0x%x, fd: %d, flags: 0x%x)",
                 "event_debug_note_add_",ev,(ulong)(uint)(int)ev->ev_events,(ulong)(uint)ev->ev_fd,
                 (ulong)(uint)(int)(ev->ev_evcallback).evcb_flags);
    }
    peVar20->field_0x10 = peVar20->field_0x10 | 1;
    if (event_debug_map_lock_ != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,event_debug_map_lock_);
    }
  }
  event_debug_mode_too_late = 1;
  return iVar13;
}

Assistant:

int
event_add_nolock_(struct event *ev, const struct timeval *tv,
    int tv_is_absolute)
{
	struct event_base *base = ev->ev_base;
	int res = 0;
	int notify = 0;

	EVENT_BASE_ASSERT_LOCKED(base);
	event_debug_assert_is_setup_(ev);

	event_debug((
		 "event_add: event: %p (fd "EV_SOCK_FMT"), %s%s%s%scall %p",
		 ev,
		 EV_SOCK_ARG(ev->ev_fd),
		 ev->ev_events & EV_READ ? "EV_READ " : " ",
		 ev->ev_events & EV_WRITE ? "EV_WRITE " : " ",
		 ev->ev_events & EV_CLOSED ? "EV_CLOSED " : " ",
		 tv ? "EV_TIMEOUT " : " ",
		 ev->ev_callback));

	EVUTIL_ASSERT(!(ev->ev_flags & ~EVLIST_ALL));

	if (ev->ev_flags & EVLIST_FINALIZING) {
		/* XXXX debug */
		return (-1);
	}

	/*
	 * prepare for timeout insertion further below, if we get a
	 * failure on any step, we should not change any state.
	 */
	if (tv != NULL && !(ev->ev_flags & EVLIST_TIMEOUT)) {
		if (min_heap_reserve_(&base->timeheap,
			1 + min_heap_size_(&base->timeheap)) == -1)
			return (-1);  /* ENOMEM == errno */
	}

	/* If the main thread is currently executing a signal event's
	 * callback, and we are not the main thread, then we want to wait
	 * until the callback is done before we mess with the event, or else
	 * we can race on ev_ncalls and ev_pncalls below. */
#ifndef EVENT__DISABLE_THREAD_SUPPORT
	if (base->current_event == event_to_event_callback(ev) &&
	    (ev->ev_events & EV_SIGNAL)
	    && !EVBASE_IN_THREAD(base)) {
		++base->current_event_waiters;
		EVTHREAD_COND_WAIT(base->current_event_cond, base->th_base_lock);
	}
#endif

	if ((ev->ev_events & (EV_READ|EV_WRITE|EV_CLOSED|EV_SIGNAL)) &&
	    !(ev->ev_flags & (EVLIST_INSERTED|EVLIST_ACTIVE|EVLIST_ACTIVE_LATER))) {
		if (ev->ev_events & (EV_READ|EV_WRITE|EV_CLOSED))
			res = evmap_io_add_(base, ev->ev_fd, ev);
		else if (ev->ev_events & EV_SIGNAL)
			res = evmap_signal_add_(base, (int)ev->ev_fd, ev);
		if (res != -1)
			event_queue_insert_inserted(base, ev);
		if (res == 1) {
			/* evmap says we need to notify the main thread. */
			notify = 1;
			res = 0;
		}
	}

	/*
	 * we should change the timeout state only if the previous event
	 * addition succeeded.
	 */
	if (res != -1 && tv != NULL) {
		struct timeval now;
		int common_timeout;
#ifdef USE_REINSERT_TIMEOUT
		int was_common;
		int old_timeout_idx;
#endif

		/*
		 * for persistent timeout events, we remember the
		 * timeout value and re-add the event.
		 *
		 * If tv_is_absolute, this was already set.
		 */
		if (ev->ev_closure == EV_CLOSURE_EVENT_PERSIST && !tv_is_absolute)
			ev->ev_io_timeout = *tv;

#ifndef USE_REINSERT_TIMEOUT
		if (ev->ev_flags & EVLIST_TIMEOUT) {
			event_queue_remove_timeout(base, ev);
		}
#endif

		/* Check if it is active due to a timeout.  Rescheduling
		 * this timeout before the callback can be executed
		 * removes it from the active list. */
		if ((ev->ev_flags & EVLIST_ACTIVE) &&
		    (ev->ev_res & EV_TIMEOUT)) {
			if (ev->ev_events & EV_SIGNAL) {
				/* See if we are just active executing
				 * this event in a loop
				 */
				if (ev->ev_ncalls && ev->ev_pncalls) {
					/* Abort loop */
					*ev->ev_pncalls = 0;
				}
			}

			event_queue_remove_active(base, event_to_event_callback(ev));
		}

		gettime(base, &now);

		common_timeout = is_common_timeout(tv, base);
#ifdef USE_REINSERT_TIMEOUT
		was_common = is_common_timeout(&ev->ev_timeout, base);
		old_timeout_idx = COMMON_TIMEOUT_IDX(&ev->ev_timeout);
#endif

		if (tv_is_absolute) {
			ev->ev_timeout = *tv;
		} else if (common_timeout) {
			struct timeval tmp = *tv;
			tmp.tv_usec &= MICROSECONDS_MASK;
			evutil_timeradd(&now, &tmp, &ev->ev_timeout);
			ev->ev_timeout.tv_usec |=
			    (tv->tv_usec & ~MICROSECONDS_MASK);
		} else {
			evutil_timeradd(&now, tv, &ev->ev_timeout);
		}

		event_debug((
			 "event_add: event %p, timeout in %d seconds %d useconds, call %p",
			 ev, (int)tv->tv_sec, (int)tv->tv_usec, ev->ev_callback));

#ifdef USE_REINSERT_TIMEOUT
		event_queue_reinsert_timeout(base, ev, was_common, common_timeout, old_timeout_idx);
#else
		event_queue_insert_timeout(base, ev);
#endif

		if (common_timeout) {
			struct common_timeout_list *ctl =
			    get_common_timeout_list(base, &ev->ev_timeout);
			if (ev == TAILQ_FIRST(&ctl->events)) {
				common_timeout_schedule(ctl, &now, ev);
			}
		} else {
			struct event* top = NULL;
			/* See if the earliest timeout is now earlier than it
			 * was before: if so, we will need to tell the main
			 * thread to wake up earlier than it would otherwise.
			 * We double check the timeout of the top element to
			 * handle time distortions due to system suspension.
			 */
			if (min_heap_elt_is_top_(ev))
				notify = 1;
			else if ((top = min_heap_top_(&base->timeheap)) != NULL &&
					 evutil_timercmp(&top->ev_timeout, &now, <))
				notify = 1;
		}
	}

	/* if we are not in the right thread, we need to wake up the loop */
	if (res != -1 && notify && EVBASE_NEED_NOTIFY(base))
		evthread_notify_base(base);

	event_debug_note_add_(ev);

	return (res);
}